

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O3

void __thiscall EventPlayer::EventPlayer(EventPlayer *this,EventPlayer *ep)

{
  Time *time;
  uint uVar1;
  string local_68;
  string local_48;
  
  time = (ep->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         super_TimeDependent.xTime;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Event Generator","");
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,&local_48,&local_68);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015ddf0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__StochasticEventGenerator_0015de88;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__StochasticEventGenerator_0015ded0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_0015bf58;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_0015bff0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_0015c038;
  (this->playerFileName)._M_dataplus._M_p = (pointer)&(this->playerFileName).field_2;
  (this->playerFileName)._M_string_length = 0;
  (this->playerFileName).field_2._M_local_buf[0] = '\0';
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&this->playerBuffer,&ep->playerBuffer);
  uVar1 = ep->playerCurrentValue;
  this->playerBufferPosition = ep->playerBufferPosition;
  this->playerCurrentValue = uVar1;
  this->playerNextValue = ep->playerNextValue;
  return;
}

Assistant:

EventPlayer::EventPlayer( const EventPlayer &ep )
	: StochasticEventGenerator(ep.xTime)
{
	playerBuffer = ep.playerBuffer;
	playerBufferPosition = ep.playerBufferPosition;
	playerCurrentValue = ep.playerCurrentValue;
	playerNextValue = ep.playerNextValue;
}